

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_folder.c
# Opt level: O2

int mpt_parse_folder(DIR *cfg,mpt_path_handler_t save,void *ctx,mpt_logger *log)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  dirent *pdVar4;
  char *__file;
  mpt_parser_format fmt;
  mpt_parser_context src;
  mpt_path local_458;
  char buf [1024];
  
  src.src.line = 1;
  src.name.sect = 0xff;
  src.name.opt = 0xff;
  src.valid = 0;
  src.prev = '\0';
  src.curr = '\0';
  src.src.getc = (_func_int_void_ptr *)0x0;
  src.src.arg = (void *)0x0;
  local_458.len = 0;
  local_458.first = '\0';
  local_458.flags = '\0';
  local_458.sep = '.';
  local_458.assign = '\0';
  local_458._28_4_ = 0;
  local_458.base = (char *)0x0;
  local_458.off = 0;
  fmt.sstart = '{';
  fmt.send = '}';
  fmt.ostart = '\0';
  fmt.assign = '=';
  fmt.oend = '\0';
  fmt.esc[0] = '\"';
  fmt.esc[1] = '\'';
  fmt.esc[2] = '\0';
  fmt.com[0] = '#';
  fmt.com[1] = '\0';
  fmt.com[2] = '\0';
  fmt.com[3] = '\0';
  uVar3 = 0xffffffff;
  if (save != (mpt_path_handler_t)0x0) {
    if (cfg == (DIR *)0x0) {
      uVar3 = 0xfffffff0;
    }
    else {
      iVar1 = dirfd((DIR *)cfg);
      if (-1 < iVar1) {
        mpt_parse_format(&fmt,(char *)0x0);
        src.src.getc = mpt_getchar_stdio;
        iVar1 = 0;
        do {
          while( true ) {
            while( true ) {
              do {
                pdVar4 = readdir((DIR *)cfg);
                if (pdVar4 == (dirent *)0x0) {
                  return iVar1;
                }
              } while (pdVar4->d_name[0] == '.');
              __file = pdVar4->d_name;
              iVar2 = dirfd((DIR *)cfg);
              iVar2 = openat(iVar2,__file,0);
              if (-1 < iVar2) break;
              mpt_log(log,"mpt_parse_folder",4,"%s: %s","unable to read file",__file);
            }
            local_458.sep = '\0';
            mpt_path_set(&local_458,buf,-1);
            local_458.off = 0;
            local_458.len = 0;
            (*save)(ctx,&local_458,(mpt_value *)0x0,0,0);
            src.src.arg = fdopen(iVar2,"r");
            if ((FILE *)src.src.arg != (FILE *)0x0) break;
            mpt_log(log,"mpt_parse_folder",3,"%s: %s","unable to allocate file",__file);
            close(iVar2);
          }
          src.src.line = 1;
          uVar3 = mpt_parse_config(mpt_parse_format_pre,&fmt,&src,save,ctx);
          fclose((FILE *)src.src.arg);
          if (log != (mpt_logger *)0x0) {
            if ((int)uVar3 < 0) {
              mpt_log(log,"mpt_parse_folder",3,"%s: %d (line %d): %s","parse error",(ulong)uVar3,
                      src.src.line & 0xffffffff,__file);
              return uVar3;
            }
            mpt_log(log,"mpt_parse_folder",0x18,"%s: %s","processed file",__file);
          }
          iVar1 = 1;
        } while (-1 < (int)uVar3);
      }
    }
  }
  return uVar3;
}

Assistant:

extern int mpt_parse_folder(DIR *cfg, MPT_TYPE(path_handler) save, void *ctx, MPT_INTERFACE(logger) *log)
{
	MPT_STRUCT(parser_context) src = MPT_PARSER_INIT;
	MPT_STRUCT(path) p = MPT_PATH_INIT;
	MPT_STRUCT(parser_format) fmt = MPT_PARSER_FORMAT_INIT;
	struct dirent *dent;
	int res = 0;
	int cdir;
	
	if (!save) {
		return MPT_ERROR(BadArgument);
	}
	if (!cfg) {
		return MPT_ERROR(MissingData);
	}
	if ((cdir = dirfd(cfg)) < 0) {
		return MPT_ERROR(BadArgument);
	}
	/* allow default format override */
	mpt_parse_format(&fmt, 0);
	src.src.getc = (int (*)(void *)) mpt_getchar_stdio;
	
	while ((dent = readdir(cfg))) {
		char buf[1024];
		int cfile;
		
		/* skip current/parent directory and invisible files */
		if (dent->d_name[0] == '.') {
			continue;
		}
		if ((cfile = openat(dirfd(cfg), dent->d_name, O_RDONLY)) < 0) {
			mpt_log(log, __func__, MPT_LOG(Warning), "%s: %s", MPT_tr("unable to read file"), dent->d_name);
			continue;
		}
		p.sep = 0;
		mpt_path_set(&p, buf, -1);
		p.len = p.off = 0;
		
		/* indicate new config file start */
		save(ctx, &p, 0, 0, 0);
		
		if (!(src.src.arg = fdopen(cfile, "r"))) {
			mpt_log(log, __func__, MPT_LOG(Error), "%s: %s", MPT_tr("unable to allocate file"), dent->d_name);
			close(cfile);
			continue;
		}
		src.src.line = 1;
		res = mpt_parse_config((MPT_TYPE(input_parser)) mpt_parse_format_pre, &fmt, &src, save, ctx);
		fclose(src.src.arg);
		if (log) {
			int line = src.src.line;
			if (res < 0) {
				mpt_log(log, __func__, MPT_LOG(Error), "%s: %d (line %d): %s", MPT_tr("parse error"), res, line, dent->d_name);
			} else {
				mpt_log(log, __func__, MPT_LOG(Debug3), "%s: %s", MPT_tr("processed file"), dent->d_name);
			}
		}
		if (res < 0) {
			break;
		}
		res = 1;
	}
	return res;
}